

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

uint16_t nettlp_msg_get_dev_id(in_addr addr)

{
  int __fd;
  ssize_t sVar1;
  int *piVar2;
  pollfd x [1];
  uint16_t devid;
  int ret;
  int req;
  int sock;
  pollfd local_20;
  uint16_t local_16;
  int local_14;
  in_addr in_stack_fffffffffffffff0;
  
  local_14 = 0;
  __fd = nettlp_msg_socket(in_stack_fffffffffffffff0);
  if (0 < __fd) {
    sVar1 = write(__fd,&stack0xfffffffffffffff0,4);
    local_14 = (int)sVar1;
    local_20.events = 1;
    local_20.fd = __fd;
    local_14 = poll(&local_20,1,500);
    if (local_14 == 0) {
      piVar2 = __errno_location();
      *piVar2 = 0x3e;
    }
    else {
      sVar1 = read(__fd,&local_16,2);
      local_14 = (int)sVar1;
      if (-1 < local_14) {
        close(__fd);
        return local_16;
      }
    }
    close(__fd);
  }
  return 0;
}

Assistant:

uint16_t nettlp_msg_get_dev_id(struct in_addr addr)
{
	int sock, req, ret = 0;
	uint16_t devid;
	struct pollfd x[1];

	sock = nettlp_msg_socket(addr);
	if (sock < 1)
		return 0;

	/* send GET_BAR4 request */
	req = NETTLP_MSG_GET_DEV_ID;
	ret = write(sock, &req, sizeof(req));

	/* recv response with timeout */
	x[0].fd = sock;
	x[0].events = POLLIN;

	ret = poll(x, 1, LIBTLP_CPL_TIMEOUT);
	if (ret == 0) {
		errno = ETIME;
		goto err_out;
	}

	ret = read(sock, &devid, sizeof(devid));
	if (ret < 0)
		goto err_out;

	close(sock);
	return devid;

err_out:
	close(sock);
	return 0;
}